

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

void __thiscall AmpIO::InitBoard(AmpIO *this)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x64524131) {
    this->NumMotors = 10;
    this->NumEncoders = 7;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      this->NumMotors = 8;
      this->NumEncoders = 8;
      this->NumDouts = 8;
      goto LAB_0010be4f;
    }
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 != 0x42434647) {
      this->NumMotors = 4;
      this->NumEncoders = 4;
      this->NumDouts = 4;
      goto LAB_0010be4f;
    }
    this->NumMotors = 0;
    this->NumEncoders = 0;
  }
  this->NumDouts = 0;
LAB_0010be4f:
  uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])(this);
  if (0x103 < uVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO: Read buffer size too large: ",0x23);
    (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])(this);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (max = ",8);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") quadlets",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])(this);
  if (0x103 < uVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AmpIO: Write buffer size too large: ",0x24);
    (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])(this);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (max = ",8);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") quadlets",10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  uVar2 = this->NumEncoders;
  this->ENC_POS_OFFSET = this->NumMotors + 4;
  uVar3 = this->NumMotors + uVar2 + 4;
  this->ENC_VEL_OFFSET = uVar3;
  uVar3 = uVar3 + uVar2;
  this->ENC_FRQ_OFFSET = uVar3;
  this->ENC_QTR1_OFFSET = uVar3;
  this->ENC_QTR5_OFFSET = uVar3 + uVar2;
  uVar3 = uVar3 + uVar2 + uVar2;
  this->ENC_RUN_OFFSET = uVar3;
  this->MOTOR_STATUS_OFFSET = uVar3 + uVar2;
  this->WB_HEADER_OFFSET = 0;
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  this->WB_CURR_OFFSET = (uint)(7 < uVar1);
  this->WB_CTRL_OFFSET = (uint)(7 < uVar1) + this->NumMotors;
  if (this->NumEncoders != 0) {
    lVar5 = 0x240;
    uVar6 = 0;
    do {
      EncoderVelocity::Init((EncoderVelocity *)((long)this->ReadBuffer + lVar5 + -0x3c));
      this->encErrorCount[uVar6] = 0;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x38;
    } while (uVar6 < this->NumEncoders);
  }
  (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[5])(this);
  return;
}

Assistant:

void AmpIO::InitBoard(void)
{
    // This method should be called when the port is valid, so that GetHardwareVersion
    // and GetFirmwareVersion return the correct values.
    // If the port is not yet valid, these methods will both return 0, so board will be
    // initialized as a 4-axis QLA and assume firmware version < 8.
    if (GetHardwareVersion() == dRA1_String) {
        NumMotors = 10;
        NumEncoders = 7;
        NumDouts = 0;
    }
    else if (GetHardwareVersion() == DQLA_String) {
        NumMotors = 8;
        NumEncoders = 8;
        NumDouts = 8;
    }
    else if (GetHardwareVersion() == BCFG_String) {
        NumMotors = 0;
        NumEncoders = 0;
        NumDouts = 0;
    }
    else {
        NumMotors = 4;
        NumEncoders = 4;
        NumDouts = 4;
    }

    // Check whether buffers are too small (should never happen, but if it does, would
    // be better to exit rather than just print a message). The alternative is to use
    // dynamic memory allocation.
    if ((GetReadNumBytes()/sizeof(quadlet_t)) > ReadBufSize_Max) {
        std::cerr << "AmpIO: Read buffer size too large: " << GetReadNumBytes()/sizeof(quadlet_t)
                  << " (max = " << ReadBufSize_Max << ") quadlets" << std::endl;
    }
    if ((GetWriteNumBytes()/sizeof(quadlet_t)) > WriteBufSize_Max) {
        std::cerr << "AmpIO: Write buffer size too large: " << GetWriteNumBytes()/sizeof(quadlet_t)
                  << " (max = " << WriteBufSize_Max << ") quadlets" << std::endl;
    }

    ENC_POS_OFFSET      = MOTOR_CURR_OFFSET + NumMotors;
    ENC_VEL_OFFSET      = ENC_POS_OFFSET    + NumEncoders;
    ENC_FRQ_OFFSET      = ENC_VEL_OFFSET    + NumEncoders;
    ENC_QTR1_OFFSET     = ENC_FRQ_OFFSET;
    ENC_QTR5_OFFSET     = ENC_QTR1_OFFSET   + NumEncoders;
    ENC_RUN_OFFSET      = ENC_QTR5_OFFSET   + NumEncoders;
    MOTOR_STATUS_OFFSET = ENC_RUN_OFFSET    + NumEncoders;

    WB_HEADER_OFFSET = 0;   // only used for Firmware Rev 8+
    WB_CURR_OFFSET = (GetFirmwareVersion() < 8) ? 0 : 1;
    WB_CTRL_OFFSET = WB_CURR_OFFSET + NumMotors;

    for (size_t i = 0; i < NumEncoders; i++) {
        encVelData[i].Init();
        encErrorCount[i] = 0;
    }
    InitWriteBuffer();
}